

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall OpenMesh::PolyConnectivity::collapse_edge(PolyConnectivity *this,HalfedgeHandle _hh)

{
  undefined4 uVar1;
  HalfedgeHandle HVar2;
  HalfedgeHandle _nheh;
  HalfedgeHandle _heh;
  FaceHandle _fh;
  FaceHandle _fh_00;
  VertexHandle _vh;
  VertexHandle _vh_00;
  value_type _heh_00;
  Halfedge *pHVar3;
  Face *pFVar4;
  Vertex *pVVar5;
  StatusInfo *pSVar6;
  BaseHandle _heh_01;
  undefined1 local_68 [8];
  VertexIHalfedgeIter vih_it;
  
  vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
       ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_hh);
  HVar2 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_hh.super_BaseHandle.idx_);
  _heh_01 = (-((uint)_hh.super_BaseHandle.idx_ & 1) | 1) + _hh.super_BaseHandle.idx_;
  _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.idx_);
  _heh = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh_01.idx_);
  _fh = ArrayKernel::face_handle(&this->super_ArrayKernel,_hh);
  _fh_00 = ArrayKernel::face_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.idx_);
  _vh = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,_hh);
  _vh_00 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.idx_);
  vih_iter((VertexIHalfedgeIter *)local_68,this,_vh_00);
  while ((uVar1 = vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_,
         vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    _heh_00 = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
              ::operator*((VertexIHalfedgeIter *)local_68);
    pHVar3 = ArrayKernel::halfedge
                       (&this->super_ArrayKernel,(HalfedgeHandle)_heh_00.super_BaseHandle.idx_);
    (pHVar3->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
         (int)_vh.super_BaseHandle.idx_;
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeHalfedgeHandle>
    ::operator++((VertexIHalfedgeIter *)local_68);
  }
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,HVar2,
             (HalfedgeHandle)vih_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_)
  ;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh);
  if (_fh.super_BaseHandle.idx_ != -1) {
    pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
    (pFVar4->halfedge_handle_).super_BaseHandle.idx_ = uVar1;
  }
  if (_fh_00.super_BaseHandle.idx_ != -1) {
    pFVar4 = ArrayKernel::face(&this->super_ArrayKernel,_fh_00);
    (pFVar4->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
  }
  HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh);
  if (HVar2.super_BaseHandle.idx_ == (BaseHandle)_heh_01.idx_) {
    pVVar5 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
    (pVVar5->halfedge_handle_).super_BaseHandle.idx_ = uVar1;
  }
  adjust_outgoing_halfedge(this,_vh);
  ArrayKernel::set_isolated(&this->super_ArrayKernel,_vh_00);
  pSVar6 = ArrayKernel::status(&this->super_ArrayKernel,
                               (EdgeHandle)((int)_hh.super_BaseHandle.idx_ >> 1));
  *(byte *)&pSVar6->status_ = (byte)pSVar6->status_ | 1;
  pSVar6 = ArrayKernel::status(&this->super_ArrayKernel,_vh_00);
  *(byte *)&pSVar6->status_ = (byte)pSVar6->status_ | 1;
  return;
}

Assistant:

void PolyConnectivity::collapse_edge(HalfedgeHandle _hh)
{
  HalfedgeHandle  h  = _hh;
  HalfedgeHandle  hn = next_halfedge_handle(h);
  HalfedgeHandle  hp = prev_halfedge_handle(h);

  HalfedgeHandle  o  = opposite_halfedge_handle(h);
  HalfedgeHandle  on = next_halfedge_handle(o);
  HalfedgeHandle  op = prev_halfedge_handle(o);

  FaceHandle      fh = face_handle(h);
  FaceHandle      fo = face_handle(o);

  VertexHandle    vh = to_vertex_handle(h);
  VertexHandle    vo = to_vertex_handle(o);



  // halfedge -> vertex
  for (VertexIHalfedgeIter vih_it(vih_iter(vo)); vih_it.is_valid(); ++vih_it)
    set_vertex_handle(*vih_it, vh);


  // halfedge -> halfedge
  set_next_halfedge_handle(hp, hn);
  set_next_halfedge_handle(op, on);


  // face -> halfedge
  if (fh.is_valid())  set_halfedge_handle(fh, hn);
  if (fo.is_valid())  set_halfedge_handle(fo, on);


  // vertex -> halfedge
  if (halfedge_handle(vh) == o)  set_halfedge_handle(vh, hn);
  adjust_outgoing_halfedge(vh);
  set_isolated(vo);

  // delete stuff
  status(edge_handle(h)).set_deleted(true);
  status(vo).set_deleted(true);
}